

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void kj::_::Debug::log<char_const(&)[87],unsigned_int,unsigned_int>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [87],
               uint *params_1,uint *params_2)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  ArrayPtr<kj::String> argValues_00;
  undefined4 in_register_00000014;
  uint *params_00;
  uint *params_01;
  long lVar4;
  String argValues [3];
  String *in_stack_ffffffffffffff78;
  String local_78;
  String local_60;
  String local_48;
  
  str<char_const(&)[87]>
            (&local_78,(kj *)params,(char (*) [87])CONCAT44(in_register_00000014,severity));
  str<unsigned_int&>(&local_60,(kj *)params_1,params_00);
  str<unsigned_int&>(&local_48,(kj *)params_2,params_01);
  argValues_00.size_ = (size_t)macroArgs;
  argValues_00.ptr = in_stack_ffffffffffffff78;
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              (char *)&local_78,argValues_00);
  lVar4 = 0x30;
  do {
    lVar1 = *(long *)((long)&local_78.content.ptr + lVar4);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&local_78.content.size_ + lVar4);
      *(undefined8 *)((long)&local_78.content.ptr + lVar4) = 0;
      *(undefined8 *)((long)&local_78.content.size_ + lVar4) = 0;
      puVar3 = *(undefined8 **)((long)&local_78.content.disposer + lVar4);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}